

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Frame.cpp
# Opt level: O2

void __thiscall IRT::CFrame::AddLocalAddress(CFrame *this,string *name)

{
  int iVar1;
  IAddress *address;
  IAddress *pIVar2;
  
  address = (IAddress *)operator_new(0x18);
  pIVar2 = GetFramePointerAddress(this);
  iVar1 = this->maxOffsetFramePointer;
  this->maxOffsetFramePointer = iVar1 + 4;
  address->_vptr_IAddress = (_func_int **)&PTR__IAddress_0017aef8;
  address[1]._vptr_IAddress = (_func_int **)pIVar2;
  *(int *)&address[2]._vptr_IAddress = iVar1;
  addAddress(this,name,address);
  return;
}

Assistant:

void CFrame::AddLocalAddress(const std::string &name) {
    const CAddressInFrame *address = new CAddressInFrame(GetFramePointerAddress(), nextOffsetFromFramePointer());
    addAddress(name, address);
}